

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

float tcu::anon_unknown_3::minimalRangeDivision
                (float minDividend,float maxDividend,float minDivisor,float maxDivisor)

{
  float fVar1;
  float y;
  float maxDivisor_local;
  float minDivisor_local;
  float maxDividend_local;
  float minDividend_local;
  
  if ((((minDividend != 0.0) || (NAN(minDividend))) || (maxDividend != 0.0)) || (NAN(maxDividend)))
  {
    if ((0.0 < minDivisor) || (maxDivisor < 0.0)) {
      fVar1 = de::min<float>(minDividend / minDivisor,minDividend / maxDivisor);
      y = de::min<float>(maxDividend / minDivisor,maxDividend / maxDivisor);
      maxDividend_local = de::min<float>(fVar1,y);
    }
    else {
      fVar1 = std::numeric_limits<float>::infinity();
      maxDividend_local = -fVar1;
    }
  }
  else {
    maxDividend_local = 0.0;
  }
  return maxDividend_local;
}

Assistant:

float minimalRangeDivision (float minDividend, float maxDividend, float minDivisor, float maxDivisor)
{
	DE_ASSERT(minDividend <= maxDividend);
	DE_ASSERT(minDivisor <= maxDivisor);

	// special cases
	if (minDividend == 0.0f && maxDividend == 0.0f)
		return 0.0f;
	if (minDivisor <= 0.0f && maxDivisor >= 0.0f)
		return -std::numeric_limits<float>::infinity();

	return de::min(de::min(minDividend / minDivisor, minDividend / maxDivisor), de::min(maxDividend / minDivisor, maxDividend / maxDivisor));
}